

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O3

void * tro_tree_ctx_get_child(trt_tree_ctx *tc)

{
  lysc_node *plVar1;
  lysp_node *plVar2;
  
  if ((&tc->pn)[(ulong)(tc->lysc_tree != '\0') * 2] == (lysp_node *)0x0) {
    return (void *)0x0;
  }
  if (tc->lysc_tree != '\0') {
    plVar1 = lysc_node_child(tc->cn);
    return plVar1;
  }
  plVar2 = lysp_node_child(tc->pn);
  return plVar2;
}

Assistant:

static const void *
tro_tree_ctx_get_child(const struct trt_tree_ctx *tc)
{
    if (!tro_tree_ctx_get_node(tc)) {
        return NULL;
    }

    if (tc->lysc_tree) {
        return lysc_node_child(tc->cn);
    } else {
        return lysp_node_child(tc->pn);
    }
}